

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

int PaletteSort(PaletteSorting method,WebPPicture *pic,uint32_t *palette_sorted,uint32_t num_colors,
               uint32_t *palette)

{
  int *piVar1;
  void *pvVar2;
  uint32_t *puVar3;
  void *ptr;
  void *ptr_00;
  void *pvVar4;
  uint32_t *puVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *idx_map_00;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  void *pvVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  byte bVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  uint uVar28;
  uint *puVar29;
  uint uVar30;
  uint32_t palette_sorted_1 [256];
  uint32_t idx_map [256];
  int local_c50;
  undefined4 local_c38;
  undefined8 uStack_840;
  uint32_t local_838;
  uint auStack_834 [513];
  
  uVar17 = (ulong)num_colors;
  uVar10 = (ulong)num_colors;
  if (method == kModifiedZeng) {
    if (1 < num_colors) {
      ptr = WebPSafeCalloc((ulong)(num_colors * num_colors),4);
      if (ptr == (void *)0x0) {
        return 0;
      }
      puVar29 = pic->argb;
      uVar12 = *puVar29;
      memset(&local_838,0,0x400);
      ptr_00 = WebPSafeMalloc((long)pic->width * 2,4);
      if (ptr_00 == (void *)0x0) {
        WebPSafeFree(ptr);
        return 0;
      }
      iVar16 = pic->width;
      idx_map_00 = &local_838;
      PrepareMapToPalette(palette_sorted,num_colors,&local_c38,idx_map_00);
      iVar21 = pic->height;
      if (0 < iVar21) {
        uVar12 = ~uVar12;
        uVar13 = (ulong)(uint)pic->width;
        uVar7 = 0;
        iVar6 = 0;
        pvVar2 = (void *)((long)ptr_00 + (long)iVar16 * 4);
        pvVar19 = ptr_00;
        do {
          pvVar4 = pvVar2;
          if (0 < (int)uVar13) {
            lVar14 = 0;
            do {
              uVar22 = puVar29[lVar14];
              if (uVar22 != uVar12) {
                if (local_c38 == uVar22) {
                  lVar20 = 0;
                }
                else {
                  uVar12 = 0;
                  uVar13 = uVar17;
                  do {
                    uVar18 = (int)((uint)uVar13 + uVar12) >> 1;
                    lVar20 = (long)(int)uVar18;
                    if ((uint)(&local_c38)[lVar20] < uVar22) {
                      uVar12 = uVar18;
                      uVar18 = (uint)uVar13;
                    }
                    uVar13 = (ulong)uVar18;
                  } while ((&local_c38)[lVar20] != uVar22);
                }
                uVar7 = (&local_838)[lVar20];
                uVar12 = uVar22;
              }
              *(uint32_t *)((long)pvVar4 + lVar14 * 4) = uVar7;
              if ((lVar14 != 0) &&
                 (uVar8 = *(uint32_t *)((long)pvVar4 + lVar14 * 4 + -4), uVar7 != uVar8)) {
                piVar1 = (int *)((long)ptr + (ulong)(uVar7 * num_colors + uVar8) * 4);
                *piVar1 = *piVar1 + 1;
                piVar1 = (int *)((long)ptr + (ulong)(uVar8 * num_colors + uVar7) * 4);
                *piVar1 = *piVar1 + 1;
              }
              if ((iVar6 != 0) &&
                 (uVar8 = *(uint32_t *)((long)pvVar19 + lVar14 * 4), uVar7 != uVar8)) {
                piVar1 = (int *)((long)ptr + (ulong)(uVar7 * num_colors + uVar8) * 4);
                *piVar1 = *piVar1 + 1;
                piVar1 = (int *)((long)ptr + (ulong)(uVar8 * num_colors + uVar7) * 4);
                *piVar1 = *piVar1 + 1;
              }
              lVar14 = lVar14 + 1;
              uVar13 = (ulong)pic->width;
            } while (lVar14 < (long)uVar13);
            iVar21 = pic->height;
          }
          puVar29 = puVar29 + pic->argb_stride;
          iVar6 = iVar6 + 1;
          pvVar2 = pvVar19;
          pvVar19 = pvVar4;
        } while (iVar6 < iVar21);
      }
      WebPSafeFree(ptr_00);
      lVar14 = 0;
      uVar22 = 0;
      uVar18 = 0;
      uVar12 = 0;
      do {
        uVar17 = 0;
        uVar25 = 0;
        do {
          uVar25 = uVar25 + *(int *)((long)ptr + (ulong)(uint)((int)lVar14 + (int)uVar17) * 4);
          uVar17 = uVar17 + 1;
        } while (uVar10 != uVar17);
        uVar22 = uVar22 & 0xff;
        if (uVar12 < uVar25) {
          uVar12 = uVar25;
          uVar22 = uVar18;
        }
        uVar18 = uVar18 + 1;
        lVar14 = lVar14 + uVar10;
      } while (uVar18 != num_colors);
      uVar18 = uVar22 & 0xff;
      uVar13 = 0;
      uVar17 = 0;
      uVar12 = 0;
      do {
        uVar25 = *(uint *)((long)ptr + (ulong)(uVar18 * num_colors + (int)uVar13) * 4);
        uVar17 = uVar17 & 0xff;
        if (uVar12 < uVar25) {
          uVar17 = uVar13 & 0xffffffff;
          uVar12 = uVar25;
        }
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      local_c38._0_2_ = CONCAT11((char)uVar17,(char)uVar22);
      if (num_colors - 2 == 0) {
        uVar17 = 0;
      }
      else {
        local_838._0_1_ = 0;
        auStack_834[0] = 0;
        uVar15 = 0;
        uVar12 = 0;
        uVar13 = uVar17 & 0xff;
        do {
          if (((uVar22 & 0xff) != uVar15) && ((uVar17 & 0xff) != uVar15)) {
            uVar9 = (ulong)uVar12;
            *(char *)(&local_838 + uVar9 * 2) = (char)uVar15;
            uVar25 = *(int *)((long)ptr + uVar13 * 4) + *(int *)((long)ptr + (ulong)uVar18 * 4);
            auStack_834[uVar9 * 2] = uVar25;
            if (idx_map_00[1] < uVar25) {
              idx_map_00 = &local_838 + uVar9 * 2;
            }
            uVar12 = uVar12 + 1;
          }
          uVar15 = uVar15 + 1;
          uVar13 = (ulong)((int)uVar13 + num_colors);
          uVar18 = uVar18 + num_colors;
        } while (uVar10 != uVar15);
        uVar13 = (ulong)(num_colors - 3);
        uVar15 = (ulong)(num_colors - 2);
        uVar17 = 0;
        local_c50 = 1;
        uVar12 = 1;
        while( true ) {
          bVar24 = (byte)*idx_map_00;
          uVar18 = uVar12 + 1;
          uVar7 = (uint32_t)uVar17;
          uVar9 = uVar17 % (ulong)num_colors;
          uVar22 = uVar18;
          if ((uint)uVar9 != uVar18) {
            iVar21 = 0;
            iVar16 = local_c50;
            uVar8 = uVar7;
            do {
              uVar8 = uVar8 + 1;
              iVar21 = iVar21 + *(int *)((long)ptr +
                                        (ulong)((uint)*(byte *)((long)&local_c38 + uVar9) +
                                               bVar24 * num_colors) * 4) * iVar16;
              uVar9 = (ulong)uVar8 % (ulong)num_colors;
              iVar16 = iVar16 + -2;
            } while ((uint)uVar9 != uVar18);
            if (0 < iVar21) {
              if (uVar7 == 0) {
                uVar7 = num_colors;
              }
              uVar18 = uVar7 - 1;
              uVar17 = (ulong)uVar18;
              uVar22 = uVar12;
            }
          }
          uVar12 = uVar22;
          *(byte *)((long)&local_c38 + (ulong)uVar18) = bVar24;
          *(undefined8 *)idx_map_00 = (&uStack_840)[uVar15];
          uVar15 = uVar15 - 1;
          if (uVar15 == 0) break;
          puVar5 = &local_838;
          uVar9 = 0;
          idx_map_00 = puVar5;
          do {
            uVar22 = puVar5[1] +
                     *(int *)((long)ptr + (ulong)((uint)(byte)*puVar5 + bVar24 * num_colors) * 4);
            puVar5[1] = uVar22;
            puVar3 = puVar5;
            if (uVar22 <= idx_map_00[1]) {
              puVar3 = idx_map_00;
            }
            idx_map_00 = puVar3;
            uVar9 = uVar9 + 1;
            puVar5 = puVar5 + 2;
          } while (uVar13 != uVar9);
          uVar13 = uVar13 - 1;
          local_c50 = local_c50 + 1;
        }
      }
      WebPSafeFree(ptr);
      uVar13 = 0;
      do {
        palette[uVar13] =
             palette_sorted
             [*(byte *)((long)&local_c38 +
                       (ulong)(uint)((int)uVar17 + (int)uVar13) % (ulong)num_colors)];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
  }
  else if (method == kMinimizeDelta) {
    memcpy(palette,palette_sorted,(long)(int)num_colors << 2);
    if ((int)num_colors < 1) {
      bVar24 = 0;
    }
    else {
      uVar13 = 0;
      bVar24 = 0;
      uVar12 = 0;
      do {
        uVar22 = palette_sorted[uVar13];
        uVar18 = (uVar22 | 0xff00) - (uVar12 & 0xff00ff);
        uVar25 = uVar22 - (uVar12 & 0xff00);
        uVar12 = uVar18 >> 0x10 & 0xff;
        bVar27 = 2 - (uVar12 < 0x80);
        if (uVar12 == 0) {
          bVar27 = (byte)(uVar18 >> 0x10);
        }
        uVar12 = uVar25 >> 8 & 0xff;
        bVar11 = (0x7f < uVar12) * '\b' + 8;
        if (uVar12 == 0) {
          bVar11 = (byte)(uVar25 >> 8);
        }
        bVar23 = 0x80;
        if ((uVar18 & 0xff) < 0x80) {
          bVar23 = 0x40;
        }
        if ((uVar18 & 0xff) == 0) {
          bVar23 = (byte)uVar18;
        }
        bVar24 = bVar23 | bVar24 | bVar27 | bVar11;
        uVar13 = uVar13 + 1;
        uVar12 = uVar22;
      } while (uVar10 != uVar13);
    }
    if ((bVar24 * '\x02' & bVar24) == 0) {
      return 1;
    }
    if ((int)num_colors < 0x12) {
      if ((int)num_colors < 1) {
        return 1;
      }
    }
    else if (*palette == 0) {
      uVar17 = (ulong)(num_colors - 1);
      uVar7 = palette[uVar17];
      palette[uVar17] = 0;
      *palette = uVar7;
    }
    uVar10 = 0;
    uVar12 = 0;
    do {
      uVar22 = 0xffffffff;
      uVar15 = uVar10 & 0xffffffff;
      uVar13 = uVar10;
      do {
        uVar28 = (palette[uVar13] | 0xff0000) - (uVar12 & 0xff00ff00);
        uVar30 = (palette[uVar13] | 0xff00) - (uVar12 & 0xff00ff);
        uVar25 = uVar30 & 0xff;
        uVar18 = 0x100 - uVar25;
        if (uVar25 < 0x81) {
          uVar18 = uVar25;
        }
        uVar26 = uVar28 >> 8 & 0xff;
        uVar25 = 0x100 - uVar26;
        if (uVar26 < 0x81) {
          uVar25 = uVar26;
        }
        uVar26 = uVar30 >> 0x10 & 0xff;
        uVar30 = 0x100 - uVar26;
        if (uVar26 < 0x81) {
          uVar30 = uVar26;
        }
        uVar26 = 0x100 - (uVar28 >> 0x18);
        if (uVar28 < 0x81000000) {
          uVar26 = uVar28 >> 0x18;
        }
        uVar26 = uVar26 + (uVar30 + uVar25 + uVar18) * 9;
        if (uVar26 < uVar22) {
          uVar15 = uVar13 & 0xffffffff;
        }
        if (uVar26 <= uVar22) {
          uVar22 = uVar26;
        }
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
      uVar12 = palette[(int)uVar15];
      palette[(int)uVar15] = palette[uVar10];
      palette[uVar10] = uVar12;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar17);
  }
  else {
    if (method != kSortedDefault) {
      return 0;
    }
    if ((num_colors < 0x12) || (*palette_sorted != 0)) {
      memcpy(palette,palette_sorted,uVar10 << 2);
    }
    else {
      memcpy(palette,palette_sorted + 1,(ulong)(num_colors - 1) * 4);
      palette[num_colors - 1] = 0;
    }
  }
  return 1;
}

Assistant:

int PaletteSort(PaletteSorting method, const struct WebPPicture* const pic,
                const uint32_t* const palette_sorted, uint32_t num_colors,
                uint32_t* const palette) {
  switch (method) {
    case kSortedDefault:
      if (palette_sorted[0] == 0 && num_colors > 17) {
        memcpy(palette, palette_sorted + 1,
               (num_colors - 1) * sizeof(*palette_sorted));
        palette[num_colors - 1] = 0;
      } else {
        memcpy(palette, palette_sorted, num_colors * sizeof(*palette));
      }
      return 1;
    case kMinimizeDelta:
      PaletteSortMinimizeDeltas(palette_sorted, num_colors, palette);
      return 1;
    case kModifiedZeng:
      return PaletteSortModifiedZeng(pic, palette_sorted, num_colors, palette);
    case kUnusedPalette:
    case kPaletteSortingNum:
      break;
  }

  assert(0);
  return 0;
}